

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FileIO.cpp
# Opt level: O0

vector<unsigned_char,_std::allocator<unsigned_char>_> * read_binary_file(string *filename)

{
  char *pcVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__lhs;
  size_t __size;
  uchar *__ptr;
  runtime_error *this;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *in_RDI;
  long len;
  FILE *fp;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *data;
  char *in_stack_ffffffffffffff20;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff28;
  undefined7 in_stack_ffffffffffffff40;
  undefined1 in_stack_ffffffffffffff47;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff60;
  char *in_stack_ffffffffffffff68;
  string local_38 [32];
  FILE *local_18;
  
  pcVar1 = (char *)std::__cxx11::string::c_str();
  local_18 = fopen(pcVar1,"rb");
  if (local_18 == (FILE *)0x0) {
    __lhs = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
            __cxa_allocate_exception(0x10);
    std::operator+(in_stack_ffffffffffffff68,in_stack_ffffffffffffff60);
    std::operator+(__lhs,in_stack_ffffffffffffff20);
    std::runtime_error::runtime_error((runtime_error *)__lhs,local_38);
    __cxa_throw(__lhs,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  fseek(local_18,0,2);
  __size = ftell(local_18);
  rewind(local_18);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)0x1bc8ac);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
             CONCAT17(in_stack_ffffffffffffff47,in_stack_ffffffffffffff40),(size_type)in_RDI);
  __ptr = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                    ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)0x1bc8c7);
  pcVar1 = (char *)fread(__ptr,__size,1,local_18);
  if (pcVar1 == (char *)0x1) {
    return in_RDI;
  }
  this = (runtime_error *)__cxa_allocate_exception(0x10);
  std::operator+(in_stack_ffffffffffffff68,in_stack_ffffffffffffff60);
  std::operator+(in_stack_ffffffffffffff28,pcVar1);
  std::runtime_error::runtime_error(this,(string *)&stack0xffffffffffffff68);
  __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

std::vector<uint8_t> read_binary_file(const std::string& filename) {
  auto fp = fopen(filename.c_str(), "rb");
  if(!fp) throw std::runtime_error("File " + filename + " cannot be opened");
  fseek(fp, 0, SEEK_END);
  auto len = ftell(fp);
  rewind(fp);

  std::vector<uint8_t> data;
  data.resize(len);

  if(fread(data.data(), len, 1, fp) != 1) {
    throw std::runtime_error("File " + filename + " cannot be read");
  }

  return data;
}